

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,SMatrix<double,_3,_3> *a)

{
  basic_istream<char,_std::char_traits<char>_> *this;
  double *pdVar1;
  SMatrix<double,_3,_3> *in_RSI;
  istream *in_RDI;
  int i;
  int k;
  char c;
  bool local_1e;
  bool local_1d;
  int local_1c;
  int local_18;
  char local_11;
  SMatrix<double,_3,_3> *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator>>(in_RDI,&local_11);
  if (local_11 == '[') {
    local_18 = 0;
    while( true ) {
      local_1d = false;
      if (local_18 < 3) {
        local_1d = std::ios::operator_cast_to_bool
                             ((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
      }
      if (local_1d == false) break;
      local_1c = 0;
      while( true ) {
        local_1e = false;
        if (local_1c < 3) {
          local_1e = std::ios::operator_cast_to_bool
                               ((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
        }
        this = local_8;
        if (local_1e == false) break;
        pdVar1 = SMatrix<double,_3,_3>::operator()(local_10,local_18,local_1c);
        std::istream::operator>>(this,pdVar1);
        local_1c = local_1c + 1;
      }
      std::operator>>(local_8,&local_11);
      if ((local_18 + 1 < 3) && (local_11 != ';')) {
        std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
      }
      local_18 = local_18 + 1;
    }
    if (local_11 != ']') {
      std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
    }
  }
  else {
    std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
  }
  return local_8;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, SMatrix<T, nrows, ncols> &a)
{
  char c;

  in >> c;

  if (c == '[')
  {
    for (int k=0; k<nrows && in; k++)
    {
      for (int i=0; i<ncols && in; i++)
      {
        in >> a(k, i);
      }

      in >> c;

      if (k+1 < nrows && c != ';')
      {
        in.setstate(std::ios_base::failbit);
      }
    }

    if (c != ']')
    {
      in.setstate(std::ios_base::failbit);
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}